

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O2

RegEx * YAML::Exp::Anchor(void)

{
  int iVar1;
  RegEx *ex2;
  allocator local_69;
  string local_68;
  RegEx local_48;
  RegEx local_28;
  
  if (Anchor()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&Anchor()::e);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_68,"[]{},",&local_69);
      RegEx::RegEx(&local_48,&local_68,REGEX_OR);
      ex2 = BlankOrBreak();
      operator|(&local_28,&local_48,ex2);
      operator!(&Anchor::e,&local_28);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_28.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_48.m_params);
      std::__cxx11::string::~string((string *)&local_68);
      __cxa_atexit(RegEx::~RegEx,&Anchor::e,&__dso_handle);
      __cxa_guard_release(&Anchor()::e);
    }
  }
  return &Anchor::e;
}

Assistant:

inline const RegEx& Anchor() {
  static const RegEx e = !(RegEx("[]{},", REGEX_OR) | BlankOrBreak());
  return e;
}